

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp_test.c
# Opt level: O0

void test_udp_send_ipc(void)

{
  nng_err nVar1;
  int iVar2;
  char *pcVar3;
  size_t sVar4;
  bool local_175;
  nng_err result__4;
  nng_err result__3;
  nng_err result__2;
  nng_err result__1;
  nng_err result_;
  int rv;
  undefined1 auStack_140 [2];
  char msg [6];
  nng_iov iov1;
  nng_aio *aio1;
  nng_udp *pnStack_120;
  uint32_t loopback;
  nng_udp *u1;
  nng_sockaddr sa2;
  nng_sockaddr sa1;
  
  memset(sa2.s_ipc.sa_path + 0x7e,0,0x88);
  memset(&u1,0,0x88);
  stack0xfffffffffffffeba = 0x6c6c6568;
  rv._2_2_ = 0x6f;
  sa2.s_storage.sa_pad[0xf]._4_4_ = htonl(0x7f000001);
  sa2.s_storage.sa_pad[0xf]._0_2_ = 3;
  sa2.s_storage.sa_pad[0xf]._2_2_ = 0;
  u1._0_2_ = 2;
  strcat((char *)((long)&u1 + 2),"/tmp/bogus");
  nVar1 = nng_udp_open(&stack0xfffffffffffffee0,(nng_sockaddr *)(sa2.s_ipc.sa_path + 0x7e));
  pcVar3 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/platform/udp_test.c"
                         ,0x132,"%s: expected success, got %s (%d)","nng_udp_open(&u1, &sa1)",pcVar3
                         ,nVar1);
  if (iVar2 == 0) {
    acutest_abort_();
  }
  nVar1 = nng_udp_sockname(pnStack_120,(nng_sockaddr *)(sa2.s_ipc.sa_path + 0x7e));
  pcVar3 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/platform/udp_test.c"
                         ,0x133,"%s: expected success, got %s (%d)","nng_udp_sockname(u1, &sa1)",
                         pcVar3,nVar1);
  if (iVar2 == 0) {
    acutest_abort_();
  }
  nVar1 = nng_aio_alloc((nng_aio **)&iov1.iov_len,(_func_void_void_ptr *)0x0,(void *)0x0);
  pcVar3 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/platform/udp_test.c"
                         ,0x135,"%s: expected success, got %s (%d)",
                         "nng_aio_alloc(&aio1, NULL, NULL)",pcVar3,nVar1);
  if (iVar2 == 0) {
    acutest_abort_();
  }
  _auStack_140 = (byte *)((long)&result_ + 2);
  sVar4 = strlen((char *)((long)&result_ + 2));
  iov1.iov_buf = (void *)(sVar4 + 1);
  nVar1 = nng_aio_set_iov((nng_aio *)iov1.iov_len,1,(nng_iov *)auStack_140);
  pcVar3 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/platform/udp_test.c"
                         ,0x139,"%s: expected success, got %s (%d)",
                         "nng_aio_set_iov(aio1, 1, &iov1)",pcVar3,nVar1);
  if (iVar2 == 0) {
    acutest_abort_();
  }
  nVar1 = nng_aio_set_input((nng_aio *)iov1.iov_len,0,&u1);
  pcVar3 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/platform/udp_test.c"
                         ,0x13a,"%s: expected success, got %s (%d)",
                         "nng_aio_set_input(aio1, 0, &sa2)",pcVar3,nVar1);
  if (iVar2 == 0) {
    acutest_abort_();
  }
  nng_udp_send(pnStack_120,(nng_aio *)iov1.iov_len);
  nng_aio_wait((nng_aio *)iov1.iov_len);
  nVar1 = nng_aio_result((nng_aio *)iov1.iov_len);
  local_175 = nVar1 == NNG_EADDRINVAL || nVar1 == NNG_ENOTSUP;
  iVar2 = acutest_check_((uint)local_175,
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/platform/udp_test.c"
                         ,0x140,"%s","rv == NNG_EADDRINVAL || rv == NNG_ENOTSUP");
  if (iVar2 == 0) {
    acutest_abort_();
  }
  nng_aio_free((nng_aio *)iov1.iov_len);
  nng_udp_close(pnStack_120);
  return;
}

Assistant:

void
test_udp_send_ipc(void)
{
	nng_sockaddr sa1 = { 0 };
	nng_sockaddr sa2 = { 0 };
	nng_udp     *u1;
	uint32_t     loopback;
	nng_aio     *aio1;
	nng_iov      iov1;
	char         msg[] = "hello";
	int          rv;

	loopback = htonl(0x7f000001); // 127.0.0.1

	sa1.s_in.sa_family = NNG_AF_INET;
	sa1.s_in.sa_addr   = loopback;
	sa1.s_in.sa_port   = 0; // wild card port binding

	sa2.s_ipc.sa_family = NNG_AF_IPC;
	strcat(sa2.s_ipc.sa_path, "/tmp/bogus");

	NUTS_PASS(nng_udp_open(&u1, &sa1));
	NUTS_PASS(nng_udp_sockname(u1, &sa1));

	NUTS_PASS(nng_aio_alloc(&aio1, NULL, NULL));

	iov1.iov_buf = msg;
	iov1.iov_len = strlen(msg) + 1;
	NUTS_PASS(nng_aio_set_iov(aio1, 1, &iov1));
	NUTS_PASS(nng_aio_set_input(aio1, 0, &sa2));

	nng_udp_send(u1, aio1);
	nng_aio_wait(aio1);

	rv = nng_aio_result(aio1);
	NUTS_ASSERT(rv == NNG_EADDRINVAL || rv == NNG_ENOTSUP);

	nng_aio_free(aio1);
	nng_udp_close(u1);
}